

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgba_4444_to_xrgb_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  ushort uVar2;
  ushort *puVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)width;
  puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  puVar4 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  iVar5 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar5 != height; iVar5 = iVar5 + 1) {
    puVar1 = puVar4 + lVar6;
    for (; puVar4 < puVar1; puVar4 = puVar4 + 1) {
      uVar2 = *puVar3;
      *puVar4 = _al_rgb_scale_4[uVar2 >> 0xc] << 0x10 |
                *(int *)((long)_al_rgb_scale_4 + (ulong)(uVar2 >> 6 & 0x3c)) << 8 |
                *(uint *)((long)_al_rgb_scale_4 + (ulong)(uVar2 >> 2 & 0x3c));
      puVar3 = puVar3 + 1;
    }
    puVar3 = puVar3 + (src_pitch / 2 - lVar6);
    puVar4 = puVar4 + (dst_pitch / 4 - lVar6);
  }
  return;
}

Assistant:

static void rgba_4444_to_xrgb_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_4444_TO_XRGB_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}